

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool crnd::crnd_create_segmented_file
               (void *pData,uint32 data_size,void *pBase_data,uint base_data_size)

{
  ushort uVar1;
  uint i;
  uint32 uVar2;
  crn_header *pcVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  if ((((0x3d < data_size && pData != (void *)0x0) &&
       (pcVar3 = crnd_get_header(pData,data_size), pcVar3 != (crn_header *)0x0)) &&
      (((pcVar3->m_flags).m_buf[1] & 1) == 0)) &&
     (uVar2 = crnd_get_segmented_file_size(pData,data_size), uVar2 <= base_data_size)) {
    memcpy(pBase_data,pData,(ulong)uVar2);
    *(byte *)((long)pBase_data + 0x14) = *(byte *)((long)pBase_data + 0x14) | 1;
    lVar4 = 0;
    do {
      *(char *)((long)pBase_data + lVar4 + 6) = (char)(uVar2 >> 0x18);
      uVar2 = uVar2 << 8;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    uVar1 = *(ushort *)((long)pBase_data + 2) << 8 | *(ushort *)((long)pBase_data + 2) >> 8;
    uVar8 = *(uint *)((long)pBase_data + 6);
    uVar7 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    uVar5 = 0;
    uVar6 = 0;
    uVar8 = (uint)uVar1;
    if (uVar7 != uVar8) {
      uVar9 = 0xffff;
      lVar4 = 0;
      do {
        uVar10 = (uint)(uVar9 >> 8) & 0xff ^
                 (uint)*(byte *)((long)pBase_data + lVar4 + (ulong)uVar1);
        uVar10 = uVar10 >> 4 ^ uVar10;
        uVar10 = uVar10 << 0xc ^ uVar10 << 5 ^ ((int)uVar9 << 8 | uVar10);
        uVar9 = (ulong)uVar10;
        lVar4 = lVar4 + 1;
      } while (uVar7 - uVar8 != (int)lVar4);
      uVar6 = ~(ushort)uVar10;
    }
    *(ushort *)((long)pBase_data + 10) = uVar6 << 8 | uVar6 >> 8;
    if (uVar8 != 6) {
      uVar8 = 0xffff;
      lVar4 = 6;
      do {
        uVar7 = (uVar8 & 0xffff) >> 8 ^ (uint)*(byte *)((long)pBase_data + lVar4);
        uVar7 = uVar7 >> 4 ^ uVar7;
        uVar8 = uVar7 << 0xc ^ uVar7 << 5 ^ (uVar8 << 8 | uVar7);
        lVar4 = lVar4 + 1;
      } while ((uint)uVar1 != (uint)lVar4);
      uVar5 = ~(ushort)uVar8;
    }
    *(ushort *)((long)pBase_data + 4) = uVar5 << 8 | uVar5 >> 8;
    return true;
  }
  return false;
}

Assistant:

bool crnd_create_segmented_file(const void* pData, uint32 data_size, void* pBase_data, uint base_data_size)
    {
        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return false;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return false;

        if (pHeader->m_flags & cCRNHeaderFlagSegmented)
            return false;

        const uint actual_base_data_size = crnd_get_segmented_file_size(pData, data_size);
        if (base_data_size < actual_base_data_size)
            return false;

        memcpy(pBase_data, pData, actual_base_data_size);

        crn_header& new_header = *static_cast<crn_header*>(pBase_data);
        new_header.m_flags = new_header.m_flags | cCRNHeaderFlagSegmented;
        new_header.m_data_size = actual_base_data_size;

        new_header.m_data_crc16 = crc16((const uint8*)pBase_data + new_header.m_header_size, new_header.m_data_size - new_header.m_header_size);

        new_header.m_header_crc16 = crc16(&new_header.m_data_size, new_header.m_header_size - (uint32)((const uint8*)&new_header.m_data_size - (const uint8*)&new_header));

        CRND_ASSERT(crnd_validate_file(&new_header, actual_base_data_size, NULL));

        return true;
    }